

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_text.cpp
# Opt level: O2

void __thiscall Am_Font_Data::~Am_Font_Data(Am_Font_Data *this)

{
  Font_Index *pFVar1;
  Font_Index *pFVar2;
  
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002eb740;
  if (this->name != (char *)0x0) {
    operator_delete(this->name);
  }
  if (this->main_display != (Display *)0x0) {
    XFreeFont(this->main_display,this->main_xfont);
  }
  pFVar2 = this->font_head;
  while (pFVar2 != (Font_Index *)0x0) {
    pFVar1 = pFVar2->next;
    pFVar2->next = (Font_Index *)0x0;
    XFreeFont(pFVar2->dpy,pFVar2->xfont);
    operator_delete(pFVar2);
    pFVar2 = pFVar1;
  }
  this->font_head = (Font_Index *)0x0;
  remove((char *)this);
  return;
}

Assistant:

Am_Font_Data::~Am_Font_Data()
{
  if (name)
    delete name;
  if (main_display) {
    //// BUG: must note that font is unused
    XFreeFont(main_display, main_xfont);
  }
  Font_Index *current = font_head;
  Font_Index *next = nullptr;
  while (current) {
    next = current->next;
    current->next = nullptr;
    //// BUG: must note that font is unused
    XFreeFont(current->dpy, current->xfont);
    delete current;
    current = next;
  }
  font_head = nullptr;
  remove(this);
}